

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

shared_ptr<kratos::IfStmt> kratos::create_if_stmt_wrapper(StmtBlock *block,Port *port,bool clone)

{
  _Hash_node_base *p_Var1;
  pointer psVar2;
  element_type *extraout_RAX;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Hash_node_base *p_Var3;
  shared_ptr<kratos::Stmt> *stmt;
  undefined1 stmt_00 [8];
  shared_ptr<kratos::IfStmt> sVar4;
  shared_ptr<kratos::Stmt> local_58;
  undefined1 auStack_48 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> stmts;
  
  std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::IfStmt>,kratos::Port&>
            ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)block,
             (allocator<kratos::IfStmt> *)auStack_48,(Port *)CONCAT71(in_register_00000011,clone));
  auStack_48 = (undefined1  [8])0x0;
  stmts.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stmts.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var3 = (_Hash_node_base *)(port->super_Var).size_param_._M_h._M_bucket_count;
  p_Var1 = (port->super_Var).size_param_._M_h._M_before_begin._M_nxt;
  if (p_Var3 != p_Var1) {
    do {
      (*(code *)p_Var3->_M_nxt->_M_nxt[0xb]._M_nxt)(&local_58);
      std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
      emplace_back<std::shared_ptr<kratos::Stmt>const>
                ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                  *)auStack_48,&local_58);
      if (local_58.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      psVar2 = stmts.
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var3 = p_Var3 + 2;
      stmt_00 = auStack_48;
    } while (p_Var3 != p_Var1);
    for (; stmt_00 != (undefined1  [8])psVar2; stmt_00 = (undefined1  [8])((long)stmt_00 + 0x10)) {
      IfStmt::add_then_stmt
                ((IfStmt *)(block->super_Stmt).super_IRNode._vptr_IRNode,
                 (shared_ptr<kratos::Stmt> *)stmt_00);
    }
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          auStack_48);
  sVar4.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = extraout_RAX;
  return (shared_ptr<kratos::IfStmt>)
         sVar4.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<IfStmt> create_if_stmt_wrapper(StmtBlock* block, Port& port,
                                                      bool clone = false) {
    auto if_ = std::make_shared<IfStmt>(port);
    std::vector<std::shared_ptr<Stmt>> stmts;
    for (auto const& stmt : *block) {
        stmts.emplace_back(clone ? stmt->clone() : stmt);
    }
    if (!clone) block->clear();
    for (auto& stmt : stmts) {
        if (!clone) stmt->remove_from_parent();
        if_->add_then_stmt(stmt);
    }
    return if_;
}